

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeCopMemInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  DecodeStatus DVar4;
  uint64_t Address_00;
  uint uVar5;
  uint uVar6;
  
  uVar2 = MCInst_getOpcode(Inst);
  if ((int)uVar2 < 0x93d) {
    if (uVar2 - 0x8a < 8) goto LAB_001e322e;
    uVar2 = uVar2 - 0x18d;
joined_r0x001e322c:
    if (uVar2 < 8) goto LAB_001e322e;
  }
  else {
    if (7 < uVar2 - 0xa1e) {
      uVar2 = uVar2 - 0x93d;
      goto joined_r0x001e322c;
    }
LAB_001e322e:
    if ((Insn & 0xe00) == 0xa00) {
      return MCDisassembler_Fail;
    }
  }
  uVar5 = Insn & 0xff;
  uVar6 = Insn >> 0x17 & 1;
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 8 & 0xf));
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 0xc & 0xf));
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn >> 0x10 & 0xf]);
  uVar2 = MCInst_getOpcode(Inst);
  if ((int)uVar2 < 0x935) {
    uVar1 = uVar2 - 0x82;
    if (0xf < uVar1) {
LAB_001e32b5:
      uVar2 = uVar2 - 0x185;
      goto LAB_001e32cc;
    }
    if ((0x9999U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001e3307;
    if ((0x4444U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_001e32b5;
  }
  else {
    uVar1 = uVar2 - 0x935;
    if (uVar1 < 0x10) {
      if ((0x9999U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001e3307;
      if ((0x4444U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_001e3324;
    }
    uVar2 = uVar2 - 0xa16;
LAB_001e32cc:
    if (0xf < uVar2) goto LAB_001e332b;
    if ((0x9999U >> (uVar2 & 0x1f) & 1) != 0) {
LAB_001e3307:
      uVar5 = (uVar6 << 8 | uVar5) ^ 0x100;
      goto LAB_001e332b;
    }
    if ((0x4444U >> (uVar2 & 0x1f) & 1) == 0) goto LAB_001e332b;
  }
LAB_001e3324:
  uVar5 = uVar5 | uVar6 << 8;
LAB_001e332b:
  MCOperand_CreateImm0(Inst,(ulong)uVar5);
  uVar2 = MCInst_getOpcode(Inst);
  if ((uVar2 - 0x18d < 8) || (uVar2 - 0x8a < 8)) {
    DVar3 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_00,(void *)(ulong)(uVar2 - 0x18d));
    DVar4 = (DecodeStatus)(DVar3 == MCDisassembler_SoftFail);
    if (DVar3 == MCDisassembler_Success) {
      DVar4 = MCDisassembler_Success;
    }
  }
  else {
    DVar4 = MCDisassembler_Success;
  }
  return DVar4;
}

Assistant:

static DecodeStatus DecodeCopMemInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned CRd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned coproc = fieldFromInstruction_4(Insn, 8, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDC_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDC_POST:
		case ARM_LDC_OPTION:
		case ARM_LDCL_OFFSET:
		case ARM_LDCL_PRE:
		case ARM_LDCL_POST:
		case ARM_LDCL_OPTION:
		case ARM_STC_OFFSET:
		case ARM_STC_PRE:
		case ARM_STC_POST:
		case ARM_STC_OPTION:
		case ARM_STCL_OFFSET:
		case ARM_STCL_PRE:
		case ARM_STCL_POST:
		case ARM_STCL_OPTION:
		case ARM_t2LDC_OFFSET:
		case ARM_t2LDC_PRE:
		case ARM_t2LDC_POST:
		case ARM_t2LDC_OPTION:
		case ARM_t2LDCL_OFFSET:
		case ARM_t2LDCL_PRE:
		case ARM_t2LDCL_POST:
		case ARM_t2LDCL_OPTION:
		case ARM_t2STC_OFFSET:
		case ARM_t2STC_PRE:
		case ARM_t2STC_POST:
		case ARM_t2STC_OPTION:
		case ARM_t2STCL_OFFSET:
		case ARM_t2STCL_PRE:
		case ARM_t2STCL_POST:
		case ARM_t2STCL_OPTION:
			if (coproc == 0xA || coproc == 0xB)
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	MCOperand_CreateImm0(Inst, coproc);
	MCOperand_CreateImm0(Inst, CRd);
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2LDC2_OFFSET:
		case ARM_t2LDC2L_OFFSET:
		case ARM_t2LDC2_PRE:
		case ARM_t2LDC2L_PRE:
		case ARM_t2STC2_OFFSET:
		case ARM_t2STC2L_OFFSET:
		case ARM_t2STC2_PRE:
		case ARM_t2STC2L_PRE:
		case ARM_LDC2_OFFSET:
		case ARM_LDC2L_OFFSET:
		case ARM_LDC2_PRE:
		case ARM_LDC2L_PRE:
		case ARM_STC2_OFFSET:
		case ARM_STC2L_OFFSET:
		case ARM_STC2_PRE:
		case ARM_STC2L_PRE:
		case ARM_t2LDC_OFFSET:
		case ARM_t2LDCL_OFFSET:
		case ARM_t2LDC_PRE:
		case ARM_t2LDCL_PRE:
		case ARM_t2STC_OFFSET:
		case ARM_t2STCL_OFFSET:
		case ARM_t2STC_PRE:
		case ARM_t2STCL_PRE:
		case ARM_LDC_OFFSET:
		case ARM_LDCL_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDCL_PRE:
		case ARM_STC_OFFSET:
		case ARM_STCL_OFFSET:
		case ARM_STC_PRE:
		case ARM_STCL_PRE:
			imm = ARM_AM_getAM5Opc(U ? ARM_AM_add : ARM_AM_sub, (unsigned char)imm);
			MCOperand_CreateImm0(Inst, imm);
			break;
		case ARM_t2LDC2_POST:
		case ARM_t2LDC2L_POST:
		case ARM_t2STC2_POST:
		case ARM_t2STC2L_POST:
		case ARM_LDC2_POST:
		case ARM_LDC2L_POST:
		case ARM_STC2_POST:
		case ARM_STC2L_POST:
		case ARM_t2LDC_POST:
		case ARM_t2LDCL_POST:
		case ARM_t2STC_POST:
		case ARM_t2STCL_POST:
		case ARM_LDC_POST:
		case ARM_LDCL_POST:
		case ARM_STC_POST:
		case ARM_STCL_POST:
			imm |= U << 8;
			// fall through.
		default:
			// The 'option' variant doesn't encode 'U' in the immediate since
			// the immediate is unsigned [0,255].
			MCOperand_CreateImm0(Inst, imm);
			break;
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDC_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDC_POST:
		case ARM_LDC_OPTION:
		case ARM_LDCL_OFFSET:
		case ARM_LDCL_PRE:
		case ARM_LDCL_POST:
		case ARM_LDCL_OPTION:
		case ARM_STC_OFFSET:
		case ARM_STC_PRE:
		case ARM_STC_POST:
		case ARM_STC_OPTION:
		case ARM_STCL_OFFSET:
		case ARM_STCL_PRE:
		case ARM_STCL_POST:
		case ARM_STCL_OPTION:
			if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}